

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

bool __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
::is_root(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
          *this)

{
  char *__function;
  
  if (((ulong)this & 7) == 0) {
    if ((*(ulong *)this & 7) == 0) {
      return *(char *)(*(ulong *)this + 0xb) != '\0';
    }
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
  }
  else {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

bool is_root() const { return parent()->leaf(); }